

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O0

string * google::MakeCheckOpString<void*,void_const*>(void **v1,void **v2,char *exprtext)

{
  ostream *poVar1;
  string *psVar2;
  CheckOpMessageBuilder local_28;
  CheckOpMessageBuilder comb;
  char *exprtext_local;
  void **v2_local;
  void **v1_local;
  
  comb.stream_ = (ostringstream *)exprtext;
  base::CheckOpMessageBuilder::CheckOpMessageBuilder(&local_28,exprtext);
  poVar1 = base::CheckOpMessageBuilder::ForVar1(&local_28);
  MakeCheckOpValueString<void*>(poVar1,v1);
  poVar1 = base::CheckOpMessageBuilder::ForVar2(&local_28);
  MakeCheckOpValueString<void_const*>(poVar1,v2);
  psVar2 = base::CheckOpMessageBuilder::NewString_abi_cxx11_(&local_28);
  base::CheckOpMessageBuilder::~CheckOpMessageBuilder(&local_28);
  return psVar2;
}

Assistant:

std::string* MakeCheckOpString(const T1& v1, const T2& v2,
                               const char* exprtext) {
  base::CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}